

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::InvalidTextureSizesAreRejectedValidAreAcceptedTest::iterate
          (InvalidTextureSizesAreRejectedValidAreAcceptedTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  TestError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  undefined4 uVar6;
  undefined8 uVar5;
  long lVar4;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_multisample_2d_array_supported = bVar1;
  if (!bVar1) {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "OES_texture_storage_multisample_2d_array";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
LAB_00c146c0:
    tcu::TestContext::setTestResult(this_01,testResult,description);
    return STOP;
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  initInternals(this);
  if (this->to_id_2d_array_1 == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"First texture object has not been generated.","to_id_2d_array_1 != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
               ,0xc3);
  }
  else if (this->to_id_2d_array_2 == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Second texture object has not been generated.","to_id_2d_array_2 != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
               ,0xc4);
  }
  else if (this->to_id_2d_array_3 == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Third texture object has not been generated.","to_id_2d_array_3 != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
               ,0xc5);
  }
  else if (this->max_texture_size < 0x800) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid GL_MAX_TEXTURE_SIZE was returned.","max_texture_size >= 2048",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
               ,200);
  }
  else if (this->max_array_texture_layers < 0x100) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid GL_MAX_ARRAY_TEXTURE_LAYERS was returned.",
               "max_array_texture_layers >= 256",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
               ,0xc9);
  }
  else {
    (**(code **)(lVar4 + 0xb8))(0x9102);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,
                    "Unexpected error was generated when binding texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target."
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0xd2);
    uVar5 = CONCAT44(uVar6,1);
    (**(code **)(lVar4 + 0x13a8))(0x9102,2,0x8058,4,4,0,uVar5);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    iVar2 = (**(code **)(lVar4 + 0x800))();
    if (iVar2 == 0x501) {
      uVar5 = CONCAT44(uVar6,1);
      (**(code **)(lVar4 + 0x13a8))(0x9102,2,0x8058,4,4,this->max_array_texture_layers + 1,uVar5);
      uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 == 0x501) {
        uVar5 = CONCAT44(uVar6,1);
        (**(code **)(lVar4 + 0x13a8))(0x9102,2,0x8058,4,4,1,uVar5);
        uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"gltexStorage3DMultisample() reported unexpected error code.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                        ,0xf1);
        (**(code **)(lVar4 + 0xb8))(0x9102,this->to_id_2d_array_2);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,
                        "Unexpected error was generated when binding texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target."
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                        ,0xfa);
        uVar5 = CONCAT44(uVar6,1);
        (**(code **)(lVar4 + 0x13a8))(0x9102,2,0x8058,4,4,this->max_array_texture_layers,uVar5);
        uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"gltexStorage3DMultisample() reported unexpected error code.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                        ,0x103);
        (**(code **)(lVar4 + 0xb8))(0x9102,this->to_id_2d_array_3);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,
                        "Unexpected error was generated when binding texture object to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target."
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                        ,0x10c);
        uVar5 = CONCAT44(uVar6,1);
        (**(code **)(lVar4 + 0x13a8))
                  (0x9102,2,0x8058,this->max_texture_size + 1,this->max_texture_size,2,uVar5);
        uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
        iVar2 = (**(code **)(lVar4 + 0x800))();
        if (iVar2 == 0x501) {
          (**(code **)(lVar4 + 0x13a8))
                    (0x9102,2,0x8058,this->max_texture_size,this->max_texture_size + 1,2,
                     CONCAT44(uVar6,1));
          iVar2 = (**(code **)(lVar4 + 0x800))();
          if (iVar2 == 0x501) {
            this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
            description = "Pass";
            testResult = QP_TEST_RESULT_PASS;
            goto LAB_00c146c0;
          }
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.",
                     "error_code == GL_INVALID_VALUE",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                     ,0x124);
        }
        else {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.",
                     "error_code == GL_INVALID_VALUE",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                     ,0x118);
        }
      }
      else {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.",
                   "error_code == GL_INVALID_VALUE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                   ,0xe9);
      }
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.",
                 "error_code == GL_INVALID_VALUE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                 ,0xdd);
    }
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult InvalidTextureSizesAreRejectedValidAreAcceptedTest::iterate()
{
	gl_oes_texture_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	if (!gl_oes_texture_multisample_2d_array_supported)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "OES_texture_storage_multisample_2d_array");

		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Check if texture objects were generated properly. */
	TCU_CHECK_MSG(to_id_2d_array_1 != 0, "First texture object has not been generated.");
	TCU_CHECK_MSG(to_id_2d_array_2 != 0, "Second texture object has not been generated.");
	TCU_CHECK_MSG(to_id_2d_array_3 != 0, "Third texture object has not been generated.");

	/* Make sure valid maximum 3d image dimensions were returned. */
	TCU_CHECK_MSG(max_texture_size >= 2048, "Invalid GL_MAX_TEXTURE_SIZE was returned.");
	TCU_CHECK_MSG(max_array_texture_layers >= 256, "Invalid GL_MAX_ARRAY_TEXTURE_LAYERS was returned.");

	/* Bind texture object to_id_2d_array_1 to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_array_1);

	/* Make sure no error was generated. */
	glw::GLenum error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "Unexpected error was generated when binding texture object to "
									"GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target.");

	/* Call gltexStorage3DMultisample() with invalid depth argument value (depth value cannot be negative). */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, 4, 4,
							   0, /* Invalid depth argument value. */
							   GL_TRUE);

	/* Expect GL_INVALID_VALUE error code. */
	error_code = gl.getError();

	TCU_CHECK_MSG(error_code == GL_INVALID_VALUE,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.");

	/* Call gltexStorage3DMultisample() with invalid depth argument value
	 * (depth value cannot be greater than GL_MAX_TEXTURE_SIZE). */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, 4, 4,
							   max_array_texture_layers + 1, /* Invalid depth argument value. */
							   GL_TRUE);

	/* Expect GL_INVALID_VALUE error code. */
	error_code = gl.getError();

	TCU_CHECK_MSG(error_code == GL_INVALID_VALUE,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.");

	/* Set up a valid immutable 2D array multisample texture object using gltexStorage3DMultisample() call. */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, 4, 4, 1, GL_TRUE);

	/* Make sure no error was generated. */
	error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "gltexStorage3DMultisample() reported unexpected error code.");

	/* Bind texture object to_id_2d_array_2 to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_array_2);

	/* Make sure no error was generated. */
	error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "Unexpected error was generated when binding texture object to "
									"GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target.");

	/* Set up a valid immutable 2D array multisample texture object using gltexStorage3DMultisample() call. */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, 4, 4, max_array_texture_layers,
							   GL_TRUE);

	/* Make sure no error was generated. */
	error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "gltexStorage3DMultisample() reported unexpected error code.");

	/* Bind texture object to_id_2d_array_3 to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id_2d_array_3);

	/* Make sure no error was generated. */
	error_code = gl.getError();

	GLU_EXPECT_NO_ERROR(error_code, "Unexpected error was generated when binding texture object to "
									"GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target.");

	/* Call gltexStorage3DMultisample() with invalid width argument value
	 * (width value cannot be greater than GL_MAX_3D_TEXTURE_SIZE). */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8,
							   max_texture_size + 1, /* Invalid width argument value. */
							   max_texture_size, 2, GL_TRUE);

	/* Expect GL_INVALID_VALUE error code. */
	error_code = gl.getError();

	TCU_CHECK_MSG(error_code == GL_INVALID_VALUE,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.");

	/* Call gltexStorage3DMultisample() with invalid height argument value
	 * (height value cannot be greater than GL_MAX_3D_TEXTURE_SIZE). */
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, GL_RGBA8, max_texture_size,
							   max_texture_size + 1, /* Invalid height argument value. */
							   2, GL_TRUE);

	/* Expect GL_INVALID_VALUE error code. */
	error_code = gl.getError();

	TCU_CHECK_MSG(error_code == GL_INVALID_VALUE,
				  "gltexStorage3DMultisample() did not generate GL_INVALID_VALUE error.");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}